

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O3

void __thiscall cmGraphVizWriter::WriteGlobalFile(cmGraphVizWriter *this,char *fileName)

{
  _Rb_tree_header *p_Var1;
  char cVar2;
  pointer pcVar3;
  size_t sVar4;
  cmGraphVizWriter *this_00;
  cmGraphVizWriter *pcVar5;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  insertedNodes;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  insertedConnections;
  cmGeneratedFileStream str;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Stack_2d8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a8;
  undefined1 local_278 [584];
  
  CollectTargetsAndLibs(this);
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_278,fileName,false);
  if (((byte)(*(_func_int **)(local_278._0_8_ + -0x18))[(long)(local_278 + 0x20)] & 5) == 0) {
    WriteHeader(this,(cmGeneratedFileStream *)local_278);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Writing ",8);
    if (fileName == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x5b4740);
    }
    else {
      sVar4 = strlen(fileName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,fileName,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"...",3);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
    this_00 = (cmGraphVizWriter *)std::ostream::put('@');
    std::ostream::flush();
    local_2a8._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_2a8._M_impl.super__Rb_tree_header._M_header;
    local_2a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_2a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_2a8._M_impl.super__Rb_tree_header._M_node_count = 0;
    _Stack_2d8._M_impl.super__Rb_tree_header._M_header._M_left =
         &_Stack_2d8._M_impl.super__Rb_tree_header._M_header;
    _Stack_2d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    _Stack_2d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    _Stack_2d8._M_impl.super__Rb_tree_header._M_node_count = 0;
    pcVar5 = (cmGraphVizWriter *)
             (this->TargetPtrs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->TargetPtrs)._M_t._M_impl.super__Rb_tree_header;
    _Stack_2d8._M_impl.super__Rb_tree_header._M_header._M_right =
         _Stack_2d8._M_impl.super__Rb_tree_header._M_header._M_left;
    local_2a8._M_impl.super__Rb_tree_header._M_header._M_right =
         local_2a8._M_impl.super__Rb_tree_header._M_header._M_left;
    if (pcVar5 != (cmGraphVizWriter *)p_Var1) {
      do {
        this_00 = pcVar5;
        pcVar3 = (this_00->GraphHeader)._M_dataplus._M_p;
        if (pcVar3 != (pointer)0x0) {
          switch(*(undefined4 *)(pcVar3 + 0x2e0)) {
          case 0:
            cVar2 = this->GenerateForExecutables;
            break;
          case 1:
            cVar2 = this->GenerateForStaticLibs;
            break;
          case 2:
            cVar2 = this->GenerateForSharedLibs;
            break;
          case 3:
            cVar2 = this->GenerateForModuleLibs;
            break;
          default:
            goto switchD_003a0a12_default;
          }
          if (cVar2 != '\0') {
            WriteConnections(this,&this_00->GraphName,
                             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&_Stack_2d8,
                             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_2a8,(cmGeneratedFileStream *)local_278);
          }
        }
switchD_003a0a12_default:
        pcVar5 = (cmGraphVizWriter *)std::_Rb_tree_increment((_Rb_tree_node_base *)this_00);
      } while (pcVar5 != (cmGraphVizWriter *)p_Var1);
    }
    WriteFooter(this_00,(cmGeneratedFileStream *)local_278);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&_Stack_2d8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_2a8);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
  return;
}

Assistant:

void cmGraphVizWriter::WriteGlobalFile(const char* fileName)
{
  this->CollectTargetsAndLibs();

  cmGeneratedFileStream str(fileName);
  if ( !str )
    {
    return;
    }
  this->WriteHeader(str);

  std::cout << "Writing " << fileName << "..." << std::endl;

  std::set<std::string> insertedConnections;
  std::set<std::string> insertedNodes;

  for(std::map<std::string, const cmTarget*>::const_iterator ptrIt =
                                                      this->TargetPtrs.begin();
      ptrIt != this->TargetPtrs.end();
      ++ptrIt)
    {
    if (ptrIt->second == NULL)
      {
      continue;
      }

    if (this->GenerateForTargetType(ptrIt->second->GetType()) == false)
      {
      continue;
      }

    this->WriteConnections(ptrIt->first,
                              insertedNodes, insertedConnections, str);
    }
  this->WriteFooter(str);
}